

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

uint mwGrab_(uint kb,int type,int silent)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  mwGrabData *pmVar4;
  uint uVar5;
  mwGrabData *pmVar6;
  char *pcVar7;
  uint uVar8;
  char *format;
  long lVar9;
  
  lVar3 = mwAllocLimit;
  bVar2 = mwUseLimit;
  lVar1 = mwStatCurAlloc;
  uVar5 = 65000;
  if (kb != 0) {
    uVar5 = kb;
  }
  uVar8 = 0;
  lVar9 = mwGrabSize;
  do {
    pmVar4 = mwGrabList;
    lVar9 = lVar9 + 0x400;
    if ((lVar3 < lVar1 + lVar9 & bVar2) == 1) {
      pcVar7 = "no-mans-land";
      if (type == 0xfb) {
        pcVar7 = "grabbed";
      }
      format = "grabbed: all allowed memory to %s (%u kb)\n";
LAB_001087b8:
      mwWrite(format,pcVar7,(ulong)uVar8);
      goto LAB_001087c1;
    }
    pmVar6 = (mwGrabData *)malloc(0x400);
    if (pmVar6 == (mwGrabData *)0x0) {
      pcVar7 = "no-mans-land";
      if (type == 0xfb) {
        pcVar7 = "grabbed";
      }
      format = "grabbed: all available memory to %s (%u kb)\n";
      goto LAB_001087b8;
    }
    mwGrabSize = lVar9;
    pmVar6->next = pmVar4;
    memset(pmVar6->blob,type & 0xff,0x3f4);
    pmVar6->type = type;
    uVar8 = uVar8 + 1;
    mwGrabList = pmVar6;
  } while (uVar5 != uVar8);
  pcVar7 = "no-mans-land";
  if (type == 0xfb) {
    pcVar7 = "grabbed";
  }
  mwWrite("grabbed: %u kilobytes of %s memory\n",(ulong)uVar5,pcVar7);
  uVar8 = uVar5;
LAB_001087c1:
  mwFlush();
  return uVar8;
}

Assistant:

static unsigned mwGrab_(unsigned kb, int type, int silent)
{
	unsigned i = kb;
	mwGrabData *gd;
	if (!kb) {
		i = kb = 65000U;
	}

	for (; kb; kb--) {
		if (mwUseLimit &&
			(mwStatCurAlloc + mwGrabSize + (long)sizeof(mwGrabData) > mwAllocLimit)) {
			if (!silent) {
				mwWrite("grabbed: all allowed memory to %s (%u kb)\n",
						mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		gd = (mwGrabData *) malloc(sizeof(mwGrabData));
		if (gd == NULL) {
			if (!silent) {
				mwWrite("grabbed: all available memory to %s (%u kb)\n",
						mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		mwGrabSize += (long) sizeof(mwGrabData);
		gd->next = mwGrabList;
		memset(gd->blob, type, sizeof(gd->blob));
		gd->type = type;
		mwGrabList = gd;
	}
	if (!silent) {
		mwWrite("grabbed: %u kilobytes of %s memory\n", i, mwGrabType(type));
		FLUSH();
	}
	return i;
}